

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cVertexAttribBindingTests.cpp
# Opt level: O1

bool __thiscall
glcts::anon_unknown_0::VertexAttribBindingBase::CheckFB
          (VertexAttribBindingBase *this,Vec3 *expected)

{
  int height;
  int i;
  int iVar1;
  undefined4 extraout_var;
  long lVar2;
  RenderTarget *pRVar3;
  int iVar4;
  int iVar5;
  bool bVar6;
  int iVar7;
  int iVar8;
  allocator_type local_59;
  float local_58;
  float local_54;
  float local_50;
  Vec3 g_color_max;
  vector<unsigned_char,_std::allocator<unsigned_char>_> fb;
  
  iVar1 = (*((this->super_SubcaseBase).super_GLWrapper.m_context)->m_renderCtx->_vptr_RenderContext
            [4])();
  lVar2 = CONCAT44(extraout_var,iVar1);
  local_50 = (float)(1 << (*(byte *)(lVar2 + 8) & 0x1f));
  local_54 = (float)(1 << (*(byte *)(lVar2 + 0xc) & 0x1f));
  local_58 = (float)(1 << (*(byte *)(lVar2 + 0x10) & 0x1f));
  lVar2 = 0;
  do {
    g_color_max.m_data[lVar2] = 255.0;
    lVar2 = lVar2 + 1;
  } while (lVar2 != 3);
  pRVar3 = deqp::Context::getRenderTarget((this->super_SubcaseBase).super_GLWrapper.m_context);
  iVar1 = pRVar3->m_width;
  pRVar3 = deqp::Context::getRenderTarget((this->super_SubcaseBase).super_GLWrapper.m_context);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&fb,(long)(iVar1 * pRVar3->m_height * 4),&local_59);
  pRVar3 = deqp::Context::getRenderTarget((this->super_SubcaseBase).super_GLWrapper.m_context);
  iVar1 = pRVar3->m_width;
  pRVar3 = deqp::Context::getRenderTarget((this->super_SubcaseBase).super_GLWrapper.m_context);
  height = pRVar3->m_height;
  glu::CallLogWrapper::glReadPixels
            (&(this->super_SubcaseBase).super_GLWrapper.super_CallLogWrapper,0,0,iVar1,height,0x1908
             ,0x1401,fb.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_start);
  bVar6 = height < 1;
  if (0 < height) {
    iVar5 = 0;
    iVar4 = 0;
    do {
      iVar8 = iVar4;
      if (0 < iVar1) {
        iVar8 = iVar1 * 4 + iVar4;
        iVar7 = 0;
        do {
          if (((1.0 / local_50 <
                ABS((float)fb.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                           _M_impl.super__Vector_impl_data._M_start[iVar4] / g_color_max.m_data[0] -
                    expected->m_data[0])) ||
              (1.0 / local_54 <
               ABS((float)fb.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                          _M_impl.super__Vector_impl_data._M_start[iVar4 + 1] /
                   g_color_max.m_data[1] - expected->m_data[1]))) ||
             (1.0 / local_58 <
              ABS((float)fb.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                         _M_impl.super__Vector_impl_data._M_start[iVar4 + 2] / g_color_max.m_data[2]
                  - expected->m_data[2]))) {
            anon_unknown_0::Output
                      ("Incorrect framebuffer color at pixel (%d %d). Color is (%f %f %f). Color should be (%f %f %f).\n"
                       ,(double)((float)fb.
                                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                        ._M_impl.super__Vector_impl_data._M_start[iVar4] /
                                g_color_max.m_data[0]),
                       (double)((float)fb.
                                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                       ._M_impl.super__Vector_impl_data._M_start[iVar4 + 1] /
                               g_color_max.m_data[1]),
                       (double)((float)fb.
                                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                       ._M_impl.super__Vector_impl_data._M_start[iVar4 + 2] /
                               g_color_max.m_data[2]),(double)expected->m_data[0],
                       (double)expected->m_data[1],(double)expected->m_data[2]);
            goto LAB_00c18422;
          }
          iVar7 = iVar7 + 1;
          iVar4 = iVar4 + 4;
        } while (iVar1 != iVar7);
      }
      iVar4 = iVar8;
      iVar5 = iVar5 + 1;
      bVar6 = height <= iVar5;
    } while (iVar5 != height);
  }
LAB_00c18422:
  if (fb.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(fb.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)fb.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)fb.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return bVar6;
}

Assistant:

bool CheckFB(Vec3 expected)
	{
		const tcu::RenderTarget& renderTarget = m_context.getRenderContext().getRenderTarget();
		const tcu::PixelFormat&  pixelFormat  = renderTarget.getPixelFormat();
		Vec3					 g_color_eps  = Vec3(1.f / static_cast<float>(1 << pixelFormat.redBits),
								1.f / static_cast<float>(1 << pixelFormat.greenBits),
								1.f / static_cast<float>(1 << pixelFormat.blueBits));
		Vec3				 g_color_max = Vec3(255);
		std::vector<GLubyte> fb(getWindowWidth() * getWindowHeight() * 4);
		int					 fb_w = getWindowWidth();
		int					 fb_h = getWindowHeight();
		glReadPixels(0, 0, fb_w, fb_h, GL_RGBA, GL_UNSIGNED_BYTE, &fb[0]);
		for (GLint i = 0, y = 0; y < fb_h; ++y)
			for (GLint x = 0; x < fb_w; ++x, i += 4)
			{
				if (fabs(fb[i + 0] / g_color_max[0] - expected[0]) > g_color_eps[0] ||
					fabs(fb[i + 1] / g_color_max[1] - expected[1]) > g_color_eps[1] ||
					fabs(fb[i + 2] / g_color_max[2] - expected[2]) > g_color_eps[2])
				{

					Output("Incorrect framebuffer color at pixel (%d %d). Color is (%f %f %f). "
						   "Color should be (%f %f %f).\n",
						   x, y, fb[i + 0] / g_color_max[0], fb[i + 1] / g_color_max[1], fb[i + 2] / g_color_max[2],
						   expected[0], expected[1], expected[2]);
					return false;
				}
			}
		return true;
	}